

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_consumer.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnDataConsumer::ScanChunk
          (ColumnDataConsumer *this,ColumnDataConsumerScanState *state,DataChunk *chunk)

{
  element_type *peVar1;
  const_reference pvVar2;
  ColumnDataCollectionSegment *this_00;
  
  pvVar2 = vector<duckdb::ColumnDataConsumer::ChunkReference,_true>::operator[]
                     (&this->chunk_references,state->chunk_index);
  this_00 = pvVar2->segment;
  peVar1 = (this_00->allocator).internal.
           super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (state->allocator != peVar1) {
    state->allocator = peVar1;
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)&state->current_chunk_state);
    this_00 = pvVar2->segment;
  }
  ColumnDataCollectionSegment::ReadChunk
            (this_00,(ulong)pvVar2->chunk_index_in_segment,&state->current_chunk_state,chunk,
             &this->column_ids);
  return;
}

Assistant:

void ColumnDataConsumer::ScanChunk(ColumnDataConsumerScanState &state, DataChunk &chunk) const {
	D_ASSERT(state.chunk_index < chunk_count);
	auto &chunk_ref = chunk_references[state.chunk_index];
	if (state.allocator != chunk_ref.segment->allocator.get()) {
		// Previously scanned a chunk from a different allocator, reset the handles
		state.allocator = chunk_ref.segment->allocator.get();
		state.current_chunk_state.handles.clear();
	}
	chunk_ref.segment->ReadChunk(chunk_ref.chunk_index_in_segment, state.current_chunk_state, chunk, column_ids);
}